

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::get_options
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *this)

{
  Display DVar1;
  long in_RSI;
  Machine local_20;
  undefined4 local_14;
  
  local_14 = 1;
  std::make_unique<PCCompatible::Machine::Options,Configurable::OptionsType>
            ((OptionsType *)&local_20);
  DVar1 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0xe8))
  ;
  *(Display *)(local_20._vptr_Machine + 1) = DVar1;
  (this->super_Machine)._vptr_Machine = local_20._vptr_Machine;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() override {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			return options;
		}